

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O3

void __thiscall edk2_vss2_t::vss2_store_body_t::_read(vss2_store_body_t *this)

{
  bool bVar1;
  vss2_variable_t *in_RAX;
  pointer __p;
  vss2_variable_t *this_00;
  pointer *__ptr;
  _Head_base<0UL,_edk2_vss2_t::vss2_variable_t_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  __p = (pointer)operator_new(0x18);
  (__p->
  super__Vector_base<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
           *)&this->m_variables,__p);
  while( true ) {
    this_00 = (vss2_variable_t *)operator_new(0x240);
    vss2_variable_t::vss2_variable_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    local_28._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>
    ::
    emplace_back<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>
              ((vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>
                *)(this->m_variables)._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_*,_false>
                  ._M_head_impl,
               (unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>
                *)&local_28);
    if (local_28._M_head_impl != (vss2_variable_t *)0x0) {
      (*((local_28._M_head_impl)->super_kstruct)._vptr_kstruct[1])();
    }
    if (this_00->m_signature_first != 0xaa) break;
    bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
    if (bVar1) {
      return;
    }
  }
  return;
}

Assistant:

void edk2_vss2_t::vss2_store_body_t::_read() {
    m_variables = std::unique_ptr<std::vector<std::unique_ptr<vss2_variable_t>>>(new std::vector<std::unique_ptr<vss2_variable_t>>());
    {
        int i = 0;
        vss2_variable_t* _;
        do {
            _ = new vss2_variable_t(m__io, this, m__root);
            m_variables->push_back(std::move(std::unique_ptr<vss2_variable_t>(_)));
            i++;
        } while (!( ((_->signature_first() != 170) || (_io()->is_eof())) ));
    }
}